

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

void pop_symbol(Context_conflict *ctx,SymbolMap *map)

{
  SymbolScope *pSVar1;
  
  pSVar1 = map->scope;
  if (pSVar1 != (SymbolScope *)0x0) {
    if (pSVar1->symbol != (char *)0x0) {
      hash_remove(map->hash,pSVar1->symbol);
    }
    map->scope = pSVar1->next;
    (*ctx->free)(pSVar1,ctx->malloc_data);
    return;
  }
  return;
}

Assistant:

static void pop_symbol(Context *ctx, SymbolMap *map)
{
    SymbolScope *item = map->scope;
    if (!item)
        return;
    if (item->symbol)
        hash_remove(map->hash, item->symbol);
    map->scope = item->next;
    Free(ctx, item);
}